

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * tinyfd_inputBox(char *aTitle,char *aMessage,char *aDefaultInput)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  FILE *__stream;
  char *pcVar6;
  bool bVar7;
  size_t local_f8;
  size_t local_f0;
  size_t lMessageLen;
  size_t lTitleLen;
  char *lEOF;
  termios newt;
  termios oldt;
  int lWasBasicXterm;
  int lWasXterm;
  int lWasGraphicDialog;
  int lWasGdialog;
  int lResult;
  FILE *lIn;
  char *lpDialogString;
  char *lDialogString;
  char *aDefaultInput_local;
  char *aMessage_local;
  char *aTitle_local;
  
  lpDialogString = (char *)0x0;
  bVar1 = false;
  bVar2 = false;
  bVar7 = false;
  bVar3 = false;
  tinyfd_inputBox::lBuff[0] = '\0';
  if (aTitle == (char *)0x0) {
    local_f0 = 0;
  }
  else {
    local_f0 = strlen(aTitle);
  }
  if (aMessage == (char *)0x0) {
    local_f8 = 0;
  }
  else {
    local_f8 = strlen(aMessage);
  }
  if ((aTitle == (char *)0x0) || (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 != 0)) {
    lpDialogString = (char *)malloc(local_f0 + 0x400 + local_f8);
  }
  iVar4 = osascriptPresent();
  if (iVar4 == 0) {
    iVar4 = kdialogPresent();
    if (iVar4 == 0) {
      iVar4 = zenityPresent();
      if ((((iVar4 == 0) && (iVar4 = matedialogPresent(), iVar4 == 0)) &&
          (iVar4 = shellementaryPresent(), iVar4 == 0)) && (iVar4 = qarmaPresent(), iVar4 == 0)) {
        iVar4 = gxmessagePresent();
        if ((iVar4 == 0) && (iVar4 = gmessagePresent(), iVar4 == 0)) {
          iVar4 = gdialogPresent();
          if (((iVar4 == 0) && (iVar4 = xdialogPresent(), iVar4 == 0)) &&
             (iVar4 = tkinter2Present(), iVar4 != 0)) {
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              strcpy(tinyfd_response,"python2-tkinter");
              return (char *)0x1;
            }
            strcpy(lpDialogString,gPython2Name);
            iVar4 = isTerminalRunning();
            if ((iVar4 == 0) && (iVar4 = isDarwin(), iVar4 != 0)) {
              strcat(lpDialogString," -i");
            }
            strcat(lpDialogString,
                   " -S -c \"import Tkinter,tkSimpleDialog;root=Tkinter.Tk();root.withdraw();");
            iVar4 = isDarwin();
            if (iVar4 != 0) {
              strcat(lpDialogString,
                     "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                    );
            }
            strcat(lpDialogString,"res=tkSimpleDialog.askstring(");
            if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
              strcat(lpDialogString,"title=\'");
              strcat(lpDialogString,aTitle);
              strcat(lpDialogString,"\',");
            }
            if ((aMessage != (char *)0x0) && (sVar5 = strlen(aMessage), sVar5 != 0)) {
              strcat(lpDialogString,"prompt=\'");
              sVar5 = strlen(lpDialogString);
              replaceSubStr(aMessage,"\n","\\n",lpDialogString + sVar5);
              strcat(lpDialogString,"\',");
            }
            if (aDefaultInput == (char *)0x0) {
              strcat(lpDialogString,"show=\'*\'");
            }
            else {
              sVar5 = strlen(aDefaultInput);
              if (sVar5 != 0) {
                strcat(lpDialogString,"initialvalue=\'");
                strcat(lpDialogString,aDefaultInput);
                strcat(lpDialogString,"\',");
              }
            }
            strcat(lpDialogString,");\nif res is None :\n\tprint 0");
            strcat(lpDialogString,"\nelse :\n\tprint \'1\'+res\n\"");
          }
          else {
            iVar4 = gdialogPresent();
            if (((iVar4 == 0) && (iVar4 = xdialogPresent(), iVar4 == 0)) &&
               (iVar4 = tkinter3Present(), iVar4 != 0)) {
              if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                strcpy(tinyfd_response,"python3-tkinter");
                return (char *)0x1;
              }
              strcpy(lpDialogString,gPython3Name);
              strcat(lpDialogString,
                     " -S -c \"import tkinter; from tkinter import simpledialog;root=tkinter.Tk();root.withdraw();"
                    );
              strcat(lpDialogString,"res=simpledialog.askstring(");
              if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
                strcat(lpDialogString,"title=\'");
                strcat(lpDialogString,aTitle);
                strcat(lpDialogString,"\',");
              }
              if ((aMessage != (char *)0x0) && (sVar5 = strlen(aMessage), sVar5 != 0)) {
                strcat(lpDialogString,"prompt=\'");
                sVar5 = strlen(lpDialogString);
                replaceSubStr(aMessage,"\n","\\n",lpDialogString + sVar5);
                strcat(lpDialogString,"\',");
              }
              if (aDefaultInput == (char *)0x0) {
                strcat(lpDialogString,"show=\'*\'");
              }
              else {
                sVar5 = strlen(aDefaultInput);
                if (sVar5 != 0) {
                  strcat(lpDialogString,"initialvalue=\'");
                  strcat(lpDialogString,aDefaultInput);
                  strcat(lpDialogString,"\',");
                }
              }
              strcat(lpDialogString,");\nif res is None :\n\tprint(0)");
              strcat(lpDialogString,"\nelse :\n\tprint(\'1\'+res)\n\"");
            }
            else {
              iVar4 = gdialogPresent();
              if (((iVar4 == 0) && (iVar4 = xdialogPresent(), iVar4 == 0)) &&
                 ((pcVar6 = dialogName(), pcVar6 == (char *)0x0 &&
                  (iVar4 = whiptailPresent(), iVar4 == 0)))) {
                iVar4 = isTerminalRunning();
                if ((iVar4 != 0) || (pcVar6 = terminalName(), pcVar6 == (char *)0x0)) {
                  if ((gWarningDisplayed == 0) &&
                     ((iVar4 = isTerminalRunning(), iVar4 == 0 &&
                      (pcVar6 = terminalName(), pcVar6 == (char *)0x0)))) {
                    gWarningDisplayed = 1;
                    tinyfd_messageBox("missing software! (we will try basic console input)",
                                      " ___________\n/           \\ \n| tiny file |\n|  dialogs  |\n\\_____  ____/\n      \\|\ntiny file dialogs on UNIX needs:\n   applescript\nor kdialog\nor zenity (or matedialog or qarma)\nor python (2 or 3)\n + tkinter + python-dbus (optional)\nor dialog (opens console if needed)\nor xterm + bash\n   (opens console for basic input)\nor existing console for basic input"
                                      ,"ok","warning",0);
                    if ((aTitle != (char *)0x0) &&
                       (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                      strcpy(tinyfd_response,"no_solution");
                      return (char *)0x0;
                    }
                    return (char *)0x0;
                  }
                  if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)
                     ) {
                    strcpy(tinyfd_response,"basicinput");
                    return (char *)0x0;
                  }
                  if ((gWarningDisplayed == 0) && (tinyfd_forceConsole == 0)) {
                    gWarningDisplayed = 1;
                    tinyfd_messageBox("missing software! (we will try basic console input)",
                                      " ___________\n/           \\ \n| tiny file |\n|  dialogs  |\n\\_____  ____/\n      \\|\ntiny file dialogs on UNIX needs:\n   applescript\nor kdialog\nor zenity (or matedialog or qarma)\nor python (2 or 3)\n + tkinter + python-dbus (optional)\nor dialog (opens console if needed)\nor xterm + bash\n   (opens console for basic input)\nor existing console for basic input"
                                      ,"ok","warning",0);
                  }
                  if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
                    printf("\n%s\n",aTitle);
                  }
                  if ((aMessage != (char *)0x0) && (sVar5 = strlen(aMessage), sVar5 != 0)) {
                    printf("\n%s\n",aMessage);
                  }
                  printf("(esc+enter to cancel): ");
                  fflush(_stdout);
                  if (aDefaultInput == (char *)0x0) {
                    tcgetattr(0,(termios *)&newt.c_ispeed);
                    memcpy((void *)((long)&lEOF + 4),&newt.c_ispeed,0x3c);
                    newt.c_oflag = newt.c_oflag & 0xfffffff7;
                    tcsetattr(0,0,(termios *)((long)&lEOF + 4));
                  }
                  pcVar6 = fgets(tinyfd_inputBox::lBuff,0x400,_stdin);
                  if ((pcVar6 == (char *)0x0) || (tinyfd_inputBox::lBuff[0] == '\0')) {
                    free(lpDialogString);
                    return (char *)0x0;
                  }
                  if ((tinyfd_inputBox::lBuff[0] == '\n') &&
                     ((pcVar6 = fgets(tinyfd_inputBox::lBuff,0x400,_stdin), pcVar6 == (char *)0x0 ||
                      (tinyfd_inputBox::lBuff[0] == '\0')))) {
                    free(lpDialogString);
                    return (char *)0x0;
                  }
                  if (aDefaultInput == (char *)0x0) {
                    tcsetattr(0,0,(termios *)&newt.c_ispeed);
                    printf("\n");
                  }
                  printf("\n");
                  pcVar6 = strchr(tinyfd_inputBox::lBuff,0x1b);
                  if (pcVar6 != (char *)0x0) {
                    free(lpDialogString);
                    return (char *)0x0;
                  }
                  sVar5 = strlen(tinyfd_inputBox::lBuff);
                  if (gPythonName[sVar5 + 0xf] == '\n') {
                    sVar5 = strlen(tinyfd_inputBox::lBuff);
                    gPythonName[sVar5 + 0xf] = '\0';
                  }
                  free(lpDialogString);
                  aTitle_local = tinyfd_inputBox::lBuff;
                  return aTitle_local;
                }
                if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0))
                {
                  strcpy(tinyfd_response,"basicinput");
                  return (char *)0x0;
                }
                bVar3 = true;
                pcVar6 = terminalName();
                strcpy(lpDialogString,pcVar6);
                strcat(lpDialogString,"\'");
                if ((gWarningDisplayed == 0) && (tinyfd_forceConsole == 0)) {
                  gWarningDisplayed = 1;
                  tinyfd_messageBox("missing software! (we will try basic console input)",
                                    " ___________\n/           \\ \n| tiny file |\n|  dialogs  |\n\\_____  ____/\n      \\|\ntiny file dialogs on UNIX needs:\n   applescript\nor kdialog\nor zenity (or matedialog or qarma)\nor python (2 or 3)\n + tkinter + python-dbus (optional)\nor dialog (opens console if needed)\nor xterm + bash\n   (opens console for basic input)\nor existing console for basic input"
                                    ,"ok","warning",0);
                }
                if (((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) &&
                   (tinyfd_forceConsole == 0)) {
                  strcat(lpDialogString,"echo \"");
                  strcat(lpDialogString,aTitle);
                  strcat(lpDialogString,"\";echo;");
                }
                strcat(lpDialogString,"echo \"");
                if ((aMessage != (char *)0x0) && (sVar5 = strlen(aMessage), sVar5 != 0)) {
                  strcat(lpDialogString,aMessage);
                }
                strcat(lpDialogString,"\";read ");
                if (aDefaultInput == (char *)0x0) {
                  strcat(lpDialogString,"-s ");
                }
                strcat(lpDialogString,"-p \"");
                strcat(lpDialogString,"(esc+enter to cancel): \" ANSWER ");
                strcat(lpDialogString,";echo 1$ANSWER >/tmp/tinyfd.txt\';");
                strcat(lpDialogString,"cat -v /tmp/tinyfd.txt");
              }
              else {
                iVar4 = gdialogPresent();
                if (iVar4 == 0) {
                  iVar4 = xdialogPresent();
                  if (iVar4 == 0) {
                    pcVar6 = dialogName();
                    if (pcVar6 == (char *)0x0) {
                      iVar4 = isTerminalRunning();
                      if (iVar4 == 0) {
                        if ((aTitle != (char *)0x0) &&
                           (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                          strcpy(tinyfd_response,"whiptail");
                          return (char *)0x0;
                        }
                        bVar7 = true;
                        pcVar6 = terminalName();
                        strcpy(lpDialogString,pcVar6);
                        strcat(lpDialogString,"\'(whiptail ");
                      }
                      else {
                        if ((aTitle != (char *)0x0) &&
                           (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                          strcpy(tinyfd_response,"whiptail");
                          return (char *)0x0;
                        }
                        strcpy(lpDialogString,"(whiptail ");
                      }
                    }
                    else {
                      if ((aTitle != (char *)0x0) &&
                         (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                        strcpy(tinyfd_response,"dialog");
                        return (char *)0x0;
                      }
                      iVar4 = isTerminalRunning();
                      bVar7 = iVar4 == 0;
                      if (bVar7) {
                        pcVar6 = terminalName();
                        strcpy(lpDialogString,pcVar6);
                        strcat(lpDialogString,"\'(");
                        pcVar6 = dialogName();
                        strcat(lpDialogString,pcVar6);
                        strcat(lpDialogString," ");
                      }
                      else {
                        strcpy(lpDialogString,"(dialog ");
                      }
                    }
                  }
                  else {
                    if ((aTitle != (char *)0x0) &&
                       (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                      strcpy(tinyfd_response,"xdialog");
                      return (char *)0x1;
                    }
                    bVar2 = true;
                    strcpy(lpDialogString,"(Xdialog ");
                  }
                }
                else {
                  if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)
                     ) {
                    strcpy(tinyfd_response,"gdialog");
                    return (char *)0x1;
                  }
                  bVar2 = true;
                  bVar1 = true;
                  strcpy(lpDialogString,"(gdialog ");
                }
                if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
                  strcat(lpDialogString,"--title \"");
                  strcat(lpDialogString,aTitle);
                  strcat(lpDialogString,"\" ");
                }
                iVar4 = xdialogPresent();
                if ((iVar4 == 0) && (iVar4 = gdialogPresent(), iVar4 == 0)) {
                  strcat(lpDialogString,"--backtitle \"");
                  strcat(lpDialogString,"tab: move focus");
                  if ((aDefaultInput == (char *)0x0) && (!bVar1)) {
                    strcat(lpDialogString,
                           " (sometimes nothing, no blink nor star, is shown in text field)");
                  }
                  strcat(lpDialogString,"\" ");
                }
                if ((aDefaultInput != (char *)0x0) || (bVar1)) {
                  strcat(lpDialogString,"--inputbox");
                }
                else {
                  if (((!bVar2) && (pcVar6 = dialogName(), pcVar6 != (char *)0x0)) &&
                     (iVar4 = isDialogVersionBetter09b(), iVar4 != 0)) {
                    strcat(lpDialogString,"--insecure ");
                  }
                  strcat(lpDialogString,"--passwordbox");
                }
                strcat(lpDialogString," \"");
                if ((aMessage != (char *)0x0) && (sVar5 = strlen(aMessage), sVar5 != 0)) {
                  strcat(lpDialogString,aMessage);
                }
                strcat(lpDialogString,"\" 10 60 ");
                if ((aDefaultInput != (char *)0x0) && (sVar5 = strlen(aDefaultInput), sVar5 != 0)) {
                  strcat(lpDialogString,"\"");
                  strcat(lpDialogString,aDefaultInput);
                  strcat(lpDialogString,"\" ");
                }
                if (bVar2) {
                  strcat(lpDialogString,
                         ") 2>/tmp/tinyfd.txt;        if [ $? = 0 ];then tinyfdBool=1;else tinyfdBool=0;fi;        tinyfdRes=$(cat /tmp/tinyfd.txt);echo $tinyfdBool$tinyfdRes"
                        );
                }
                else {
                  strcat(lpDialogString,
                         ">/dev/tty ) 2>/tmp/tinyfd.txt;        if [ $? = 0 ];then tinyfdBool=1;else tinyfdBool=0;fi;        tinyfdRes=$(cat /tmp/tinyfd.txt);echo $tinyfdBool$tinyfdRes"
                        );
                  if (bVar7) {
                    strcat(lpDialogString," >/tmp/tinyfd0.txt\';cat /tmp/tinyfd0.txt");
                  }
                  else {
                    strcat(lpDialogString,"; clear >/dev/tty");
                  }
                }
              }
            }
          }
        }
        else {
          iVar4 = gxmessagePresent();
          if (iVar4 == 0) {
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              strcpy(tinyfd_response,"gmessage");
              return (char *)0x1;
            }
            strcpy(lpDialogString,"szAnswer=$(gmessage -buttons Ok:1,Cancel:0 -center \"");
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              strcpy(tinyfd_response,"gxmessage");
              return (char *)0x1;
            }
            strcpy(lpDialogString,"szAnswer=$(gxmessage -buttons Ok:1,Cancel:0 -center \"");
          }
          if ((aMessage != (char *)0x0) && (sVar5 = strlen(aMessage), sVar5 != 0)) {
            strcat(lpDialogString,aMessage);
          }
          strcat(lpDialogString,"\"");
          if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
            strcat(lpDialogString," -title  \"");
            strcat(lpDialogString,aTitle);
            strcat(lpDialogString,"\" ");
          }
          strcat(lpDialogString," -entrytext \"");
          if ((aDefaultInput != (char *)0x0) && (sVar5 = strlen(aDefaultInput), sVar5 != 0)) {
            strcat(lpDialogString,aDefaultInput);
          }
          strcat(lpDialogString,"\"");
          strcat(lpDialogString,");echo $?$szAnswer");
        }
      }
      else {
        iVar4 = zenityPresent();
        if (iVar4 == 0) {
          iVar4 = matedialogPresent();
          if (iVar4 == 0) {
            iVar4 = shellementaryPresent();
            if (iVar4 == 0) {
              if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                strcpy(tinyfd_response,"qarma");
                return (char *)0x1;
              }
              strcpy(lpDialogString,"szAnswer=$(qarma");
              pcVar6 = getenv("SSH_TTY");
              if (pcVar6 == (char *)0x0) {
                strcat(lpDialogString,
                       " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
              }
            }
            else {
              if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                strcpy(tinyfd_response,"shellementary");
                return (char *)0x1;
              }
              strcpy(lpDialogString,"szAnswer=$(shellementary");
            }
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              strcpy(tinyfd_response,"matedialog");
              return (char *)0x1;
            }
            strcpy(lpDialogString,"szAnswer=$(matedialog");
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
            strcpy(tinyfd_response,"zenity");
            return (char *)0x1;
          }
          strcpy(lpDialogString,"szAnswer=$(zenity");
          iVar4 = zenity3Present();
          if ((3 < iVar4) && (pcVar6 = getenv("SSH_TTY"), pcVar6 == (char *)0x0)) {
            strcat(lpDialogString,
                   " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
          }
        }
        strcat(lpDialogString," --entry");
        if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
          strcat(lpDialogString," --title=\"");
          strcat(lpDialogString,aTitle);
          strcat(lpDialogString,"\"");
        }
        if ((aMessage != (char *)0x0) && (sVar5 = strlen(aMessage), sVar5 != 0)) {
          strcat(lpDialogString," --text=\"");
          strcat(lpDialogString,aMessage);
          strcat(lpDialogString,"\"");
        }
        if ((aDefaultInput == (char *)0x0) || (sVar5 = strlen(aDefaultInput), sVar5 == 0)) {
          strcat(lpDialogString," --hide-text");
        }
        else {
          strcat(lpDialogString," --entry-text=\"");
          strcat(lpDialogString,aDefaultInput);
          strcat(lpDialogString,"\"");
        }
        if (tinyfd_silent != 0) {
          strcat(lpDialogString," 2>/dev/null ");
        }
        strcat(lpDialogString,");if [ $? = 0 ];then echo 1$szAnswer;else echo 0$szAnswer;fi");
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
        strcpy(tinyfd_response,"kdialog");
        return (char *)0x1;
      }
      strcpy(lpDialogString,"szAnswer=$(kdialog");
      iVar4 = kdialogPresent();
      if (iVar4 == 2) {
        strcat(lpDialogString," --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)")
        ;
      }
      if (aDefaultInput == (char *)0x0) {
        strcat(lpDialogString," --password ");
      }
      else {
        strcat(lpDialogString," --inputbox ");
      }
      strcat(lpDialogString,"\"");
      if ((aMessage != (char *)0x0) && (sVar5 = strlen(aMessage), sVar5 != 0)) {
        strcat(lpDialogString,aMessage);
      }
      strcat(lpDialogString,"\" \"");
      if ((aDefaultInput != (char *)0x0) && (sVar5 = strlen(aDefaultInput), sVar5 != 0)) {
        strcat(lpDialogString,aDefaultInput);
      }
      strcat(lpDialogString,"\"");
      if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
        strcat(lpDialogString," --title \"");
        strcat(lpDialogString,aTitle);
        strcat(lpDialogString,"\"");
      }
      strcat(lpDialogString,");if [ $? = 0 ];then echo 1$szAnswer;else echo 0$szAnswer;fi");
    }
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
      strcpy(tinyfd_response,"applescript");
      return (char *)0x1;
    }
    strcpy(lpDialogString,"osascript ");
    iVar4 = osx9orBetter();
    if (iVar4 == 0) {
      strcat(lpDialogString," -e \'tell application \"System Events\"\' -e \'Activate\'");
    }
    strcat(lpDialogString," -e \'try\' -e \'display dialog \"");
    if ((aMessage != (char *)0x0) && (sVar5 = strlen(aMessage), sVar5 != 0)) {
      strcat(lpDialogString,aMessage);
    }
    strcat(lpDialogString,"\" ");
    strcat(lpDialogString,"default answer \"");
    if ((aDefaultInput != (char *)0x0) && (sVar5 = strlen(aDefaultInput), sVar5 != 0)) {
      strcat(lpDialogString,aDefaultInput);
    }
    strcat(lpDialogString,"\" ");
    if (aDefaultInput == (char *)0x0) {
      strcat(lpDialogString,"hidden answer true ");
    }
    if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
      strcat(lpDialogString,"with title \"");
      strcat(lpDialogString,aTitle);
      strcat(lpDialogString,"\" ");
    }
    strcat(lpDialogString,"with icon note\' ");
    strcat(lpDialogString,"-e \'\"1\" & text returned of result\' ");
    strcat(lpDialogString,"-e \'on error number -128\' ");
    strcat(lpDialogString,"-e \'0\' ");
    strcat(lpDialogString,"-e \'end try\'");
    iVar4 = osx9orBetter();
    if (iVar4 == 0) {
      strcat(lpDialogString," -e \'end tell\'");
    }
  }
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",lpDialogString);
  }
  __stream = popen(lpDialogString,"r");
  if (__stream == (FILE *)0x0) {
    iVar4 = fileExists("/tmp/tinyfd.txt");
    if (iVar4 != 0) {
      wipefile("/tmp/tinyfd.txt");
      remove("/tmp/tinyfd.txt");
    }
    iVar4 = fileExists("/tmp/tinyfd0.txt");
    if (iVar4 != 0) {
      wipefile("/tmp/tinyfd0.txt");
      remove("/tmp/tinyfd0.txt");
    }
    free(lpDialogString);
    aTitle_local = (char *)0x0;
  }
  else {
    do {
      pcVar6 = fgets(tinyfd_inputBox::lBuff,0x400,__stream);
    } while (pcVar6 != (char *)0x0);
    pclose(__stream);
    iVar4 = fileExists("/tmp/tinyfd.txt");
    if (iVar4 != 0) {
      wipefile("/tmp/tinyfd.txt");
      remove("/tmp/tinyfd.txt");
    }
    iVar4 = fileExists("/tmp/tinyfd0.txt");
    if (iVar4 != 0) {
      wipefile("/tmp/tinyfd0.txt");
      remove("/tmp/tinyfd0.txt");
    }
    sVar5 = strlen(tinyfd_inputBox::lBuff);
    if (gPythonName[sVar5 + 0xf] == '\n') {
      sVar5 = strlen(tinyfd_inputBox::lBuff);
      gPythonName[sVar5 + 0xf] = '\0';
    }
    if ((bVar3) && (pcVar6 = strstr(tinyfd_inputBox::lBuff,"^["), pcVar6 != (char *)0x0)) {
      free(lpDialogString);
      aTitle_local = (char *)0x0;
    }
    else {
      iVar4 = strncmp(tinyfd_inputBox::lBuff,"1",1);
      if (iVar4 == 0) {
        free(lpDialogString);
        aTitle_local = tinyfd_inputBox::lBuff + 1;
      }
      else {
        free(lpDialogString);
        aTitle_local = (char *)0x0;
      }
    }
  }
  return aTitle_local;
}

Assistant:

char const * tinyfd_inputBox(
        char const * const aTitle , /* NULL or "" */
        char const * const aMessage , /* NULL or "" may NOT contain \n nor \t */
        char const * const aDefaultInput ) /* "" , if NULL it's a passwordBox */
{
        static char lBuff [MAX_PATH_OR_CMD] ;
        char * lEOF;

#ifndef TINYFD_NOLIB
        DWORD mode = 0;
        HANDLE hStdin = GetStdHandle(STD_INPUT_HANDLE);

        if ((!tinyfd_forceConsole || !( 
                GetConsoleWindow() || 
                dialogPresent()))
                && ( !getenv("SSH_CLIENT") || getenv("DISPLAY") ) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                lBuff[0]='\0';
                return inputBoxWinGui(lBuff, aTitle, aMessage, aDefaultInput);
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return (char const *)0;}
                lBuff[0]='\0';
                return inputBoxWinConsole(lBuff,aTitle,aMessage,aDefaultInput);
        }
        else 
        {
      if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return (char const *)0;}
      lBuff[0]='\0';
      if (!gWarningDisplayed && !tinyfd_forceConsole)
      {
          gWarningDisplayed = 1 ;
          printf("\n\n%s\n", gTitle);
          printf("%s\n\n", tinyfd_needs);
      }
      if ( aTitle && strlen(aTitle) )
      {
          printf("\n%s\n\n", aTitle);
      }
      if ( aMessage && strlen(aMessage) )
      {
          printf("%s\n",aMessage);
      }
      printf("(ctrl-Z + enter to cancel): ");
#ifndef TINYFD_NOLIB
      if ( ! aDefaultInput )
      {
          GetConsoleMode(hStdin,&mode);
          SetConsoleMode(hStdin,mode & (~ENABLE_ECHO_INPUT) );
      }
#endif /* TINYFD_NOLIB */
      lEOF = fgets(lBuff, MAX_PATH_OR_CMD, stdin);
      if ( ! lEOF )
      {
          return NULL;
      }
#ifndef TINYFD_NOLIB
      if ( ! aDefaultInput )
      {
          SetConsoleMode(hStdin,mode);
          printf("\n");
      }
#endif /* TINYFD_NOLIB */
      printf("\n");
      if ( strchr(lBuff,27) )
      {
          return NULL ;
      }
      if ( lBuff[strlen( lBuff ) -1] == '\n' )
      {
          lBuff[strlen( lBuff ) -1] = '\0' ;
      }
      return lBuff ;
  }
}